

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::NetAliasSyntax::NetAliasSyntax
          (NetAliasSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token keyword,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *nets,Token semi)

{
  Token TVar1;
  bool bVar2;
  ExpressionSyntax *pEVar3;
  undefined8 uVar4;
  ExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *nets_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  NetAliasSyntax *this_local;
  Token keyword_local;
  
  TVar1 = semi;
  uVar4 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,NetAlias,attributes);
  (this->keyword).kind = (short)uVar4;
  (this->keyword).field_0x2 = (char)((ulong)uVar4 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar4 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar4 >> 0x20);
  (this->keyword).info = keyword.info;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList(&this->nets,nets);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  (this->nets).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin(&this->nets);
  _child = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(&this->nets);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::ExpressionSyntax_*> *)&child
                        );
    if (!bVar2) break;
    pEVar3 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::operator*
                       ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&__end2.index);
    (pEVar3->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

NetAliasSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<ExpressionSyntax>& nets, Token semi) :
        MemberSyntax(SyntaxKind::NetAlias, attributes), keyword(keyword), nets(nets), semi(semi) {
        this->nets.parent = this;
        for (auto child : this->nets)
            child->parent = this;
    }